

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O1

ssize_t __thiscall
RenX::ExemptionDatabase::write(ExemptionDatabase *this,int __fd,void *__buf,size_t __n)

{
  __mbstate_t _Var1;
  long lVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  fpos_t *__pos;
  DataBuffer buffer;
  __mbstate_t *local_30;
  
  __pos = (fpos_t *)CONCAT44(in_register_00000034,__fd);
  Jupiter::DataBuffer::DataBuffer((DataBuffer *)&stack0xffffffffffffffc0);
  fgetpos((FILE *)__buf,__pos);
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  *(char *)local_30 = (char)__pos[1].__pos;
  local_30 = (__mbstate_t *)((long)local_30 + 1);
  _Var1 = __pos[1].__state;
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  *local_30 = (__mbstate_t)((long)_Var1 / 1000000000);
  local_30 = (__mbstate_t *)((long *)local_30 + 1);
  lVar2 = __pos[2].__pos;
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  *local_30 = (__mbstate_t)lVar2;
  local_30 = (__mbstate_t *)((long *)local_30 + 1);
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  *local_30 = __pos[2].__state;
  local_30 = local_30 + 1;
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  local_30->__count = (int)__pos[3].__pos;
  local_30 = (__mbstate_t *)&local_30->__value;
  Jupiter::DataBuffer::secure((ulong)&stack0xffffffffffffffc0);
  *(char *)local_30 = *(char *)((long)&__pos[3].__pos + 4);
  local_30 = (__mbstate_t *)((long)local_30 + 1);
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
  push<char,std::char_traits<char>,std::allocator<char>>
            ((DataBuffer *)&stack0xffffffffffffffc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__pos[3].__state)
  ;
  Jupiter::DataBuffer::push_to((_IO_FILE *)&stack0xffffffffffffffc0);
  fgetpos((FILE *)__buf,(fpos_t *)&this->m_eof);
  sVar3 = Jupiter::DataBuffer::~DataBuffer((DataBuffer *)&stack0xffffffffffffffc0);
  return sVar3;
}

Assistant:

void RenX::ExemptionDatabase::write(RenX::ExemptionDatabase::Entry *entry, FILE *file) {
	Jupiter::DataBuffer buffer;
	fgetpos(file, &entry->pos);

	// push data from entry to buffer
	buffer.push(entry->flags);
	buffer.push(static_cast<int64_t>(std::chrono::duration_cast<std::chrono::seconds>(entry->timestamp.time_since_epoch()).count()));
	buffer.push(static_cast<int64_t>(entry->length.count()));
	buffer.push(entry->steamid);
	buffer.push(entry->ip);
	buffer.push(entry->prefix_length);
	buffer.push(entry->setter);

	// push buffer to file
	buffer.push_to(file);
	fgetpos(file, std::addressof(m_eof));
}